

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Lists::disp(Lists *this,DataList *dl)

{
  Object *obj;
  Object **ppOVar1;
  Ty<17UL> *l;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *dl_00;
  DisperseType local_30;
  lightlist<ICM::Object_*> *local_18;
  DataList *dl_local;
  
  local_18 = dl;
  dl_local = (DataList *)this;
  obj = (Object *)operator_new(0x10);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[](local_18,0);
  l = Object::get<17ul>(*ppOVar1);
  dl_00 = _disp(l);
  TypeBase::DisperseType::DisperseType(&local_30,dl_00);
  Objects::DataObject<(ICM::DefaultType)18>::DataObject
            ((DataObject<(ICM::DefaultType)18> *)obj,&local_30);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  TypeBase::DisperseType::~DisperseType(&local_30);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr disp(const DataList &dl) {
				return ObjectPtr(new Disperse(DisperseType(_disp(dl[0]->get<T_List>()))));
			}